

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

int Json_TokenCompare(char *pCur,char *pNext,char **ppCur2,char **ppNext2)

{
  char **ppNext2_local;
  char **ppCur2_local;
  char *pNext_local;
  char *pCur_local;
  
  pNext_local = pCur;
  if (*pCur == '\"') {
    pNext_local = pCur + 1;
  }
  ppCur2_local = (char **)pNext;
  if (pNext[-1] == ',') {
    ppCur2_local = (char **)(pNext + -1);
  }
  if (*(char *)((long)ppCur2_local + -1) == '\"') {
    ppCur2_local = (char **)((long)ppCur2_local + -1);
  }
  *ppCur2 = pNext_local;
  *ppNext2 = (char *)ppCur2_local;
  return 0;
}

Assistant:

static inline int Json_TokenCompare( char * pCur, char * pNext, char ** ppCur2, char ** ppNext2 )
{
//    int i;
    if ( *pCur == '\"' )
        pCur++;
    if ( *(pNext-1) == ',' )
        pNext--;
    if ( *(pNext-1) == '\"' )
        pNext--;
    *ppCur2 = pCur;
    *ppNext2 = pNext;
//    for ( i = 1; i < JSON_NUM_LINES; i++ )
//        if ( !strncmp( s_Types[i].pName, pCur, pNext - pCur ) )
//            return i;
    return 0;
}